

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

bool __thiscall cmGraphVizWriter::ItemNameFilteredOut(cmGraphVizWriter *this,string *itemName)

{
  bool bVar1;
  reference this_00;
  RegularExpression *regEx;
  iterator __end1;
  iterator __begin1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1;
  string *itemName_local;
  cmGraphVizWriter *this_local;
  
  bVar1 = std::operator==(itemName,">");
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = cmGlobalGenerator::IsReservedTarget(itemName);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      __end1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
               begin(&this->TargetsToIgnoreRegex);
      regEx = (RegularExpression *)
              std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                        (&this->TargetsToIgnoreRegex);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                         *)&regEx), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                  ::operator*(&__end1);
        bVar1 = cmsys::RegularExpression::is_valid(this_00);
        if ((bVar1) && (bVar1 = cmsys::RegularExpression::find(this_00,itemName), bVar1)) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGraphVizWriter::ItemNameFilteredOut(std::string const& itemName)
{
  if (itemName == ">") {
    // FIXME: why do we even receive such a target here?
    return true;
  }

  if (cmGlobalGenerator::IsReservedTarget(itemName)) {
    return true;
  }

  for (cmsys::RegularExpression& regEx : this->TargetsToIgnoreRegex) {
    if (regEx.is_valid()) {
      if (regEx.find(itemName)) {
        return true;
      }
    }
  }

  return false;
}